

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ConstantFoldingRule::Apply
          (ConstantFoldingRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  Expression *expr;
  bool bVar1;
  reference pvVar2;
  ClientContext *context;
  _func_int **local_80;
  LogicalType local_78;
  Value result_value;
  
  pvVar2 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  expr = pvVar2->_M_data;
  LogicalType::LogicalType(&local_78,SQLNULL);
  Value::Value(&result_value,&local_78);
  LogicalType::~LogicalType(&local_78);
  context = Rule::GetContext((Rule *)op);
  bVar1 = ExpressionExecutor::TryEvaluateScalar(context,expr,&result_value);
  if (bVar1) {
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((duckdb *)&local_80,&result_value);
    (this->super_Rule)._vptr_Rule = local_80;
  }
  else {
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  }
  Value::~Value(&result_value);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ConstantFoldingRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                  bool &changes_made, bool is_root) {
	auto &root = bindings[0].get();
	// the root is a scalar expression that we have to fold
	D_ASSERT(root.IsFoldable() && root.GetExpressionType() != ExpressionType::VALUE_CONSTANT);

	// use an ExpressionExecutor to execute the expression
	Value result_value;
	if (!ExpressionExecutor::TryEvaluateScalar(GetContext(), root, result_value)) {
		return nullptr;
	}
	D_ASSERT(result_value.type().InternalType() == root.return_type.InternalType());
	// now get the value from the result vector and insert it back into the plan as a constant expression
	return make_uniq<BoundConstantExpression>(result_value);
}